

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

void __thiscall
cbtQuantizedBvh::updateSubtreeHeaders
          (cbtQuantizedBvh *this,int leftChildNodexIndex,int rightChildNodexIndex)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  cbtBvhSubtreeInfo *pcVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  cbtBvhSubtreeInfo *pcVar11;
  long lVar12;
  cbtQuantizedBvhNode *pcVar13;
  cbtQuantizedBvhNode *pcVar14;
  int iVar15;
  
  pcVar14 = (this->m_quantizedContiguousNodes).m_data;
  uVar3 = -pcVar14[leftChildNodexIndex].m_escapeIndexOrTriangleIndex;
  if (-1 < pcVar14[leftChildNodexIndex].m_escapeIndexOrTriangleIndex) {
    uVar3 = 1;
  }
  uVar5 = -pcVar14[rightChildNodexIndex].m_escapeIndexOrTriangleIndex;
  if (-1 < pcVar14[rightChildNodexIndex].m_escapeIndexOrTriangleIndex) {
    uVar5 = 1;
  }
  if (uVar3 < 0x81) {
    uVar10 = (this->m_SubtreeHeaders).m_size;
    pcVar13 = pcVar14 + leftChildNodexIndex;
    uVar9 = uVar10;
    if (uVar10 == (this->m_SubtreeHeaders).m_capacity) {
      iVar15 = 1;
      if (uVar10 != 0) {
        iVar15 = uVar10 * 2;
      }
      if ((int)uVar10 < iVar15) {
        if (iVar15 == 0) {
          pcVar11 = (cbtBvhSubtreeInfo *)0x0;
        }
        else {
          pcVar11 = (cbtBvhSubtreeInfo *)cbtAlignedAllocInternal((long)iVar15 << 5,0x10);
          uVar9 = (this->m_SubtreeHeaders).m_size;
        }
        if (0 < (int)uVar9) {
          lVar12 = 0;
          do {
            puVar1 = (undefined8 *)
                     ((long)((this->m_SubtreeHeaders).m_data)->m_quantizedAabbMin + lVar12);
            uVar6 = puVar1[1];
            uVar7 = puVar1[2];
            uVar8 = puVar1[3];
            puVar2 = (undefined8 *)((long)pcVar11->m_quantizedAabbMin + lVar12);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            puVar2[2] = uVar7;
            puVar2[3] = uVar8;
            lVar12 = lVar12 + 0x20;
          } while ((ulong)uVar9 << 5 != lVar12);
        }
        pcVar4 = (this->m_SubtreeHeaders).m_data;
        if ((pcVar4 != (cbtBvhSubtreeInfo *)0x0) && ((this->m_SubtreeHeaders).m_ownsMemory == true))
        {
          cbtAlignedFreeInternal(pcVar4);
        }
        (this->m_SubtreeHeaders).m_ownsMemory = true;
        (this->m_SubtreeHeaders).m_data = pcVar11;
        (this->m_SubtreeHeaders).m_capacity = iVar15;
        uVar9 = (this->m_SubtreeHeaders).m_size;
      }
    }
    (this->m_SubtreeHeaders).m_size = uVar9 + 1;
    pcVar11 = (this->m_SubtreeHeaders).m_data;
    pcVar11[(int)uVar10].m_quantizedAabbMin[0] = pcVar13->m_quantizedAabbMin[0];
    pcVar11[(int)uVar10].m_quantizedAabbMin[1] = pcVar13->m_quantizedAabbMin[1];
    pcVar11[(int)uVar10].m_quantizedAabbMin[2] = pcVar13->m_quantizedAabbMin[2];
    pcVar11[(int)uVar10].m_quantizedAabbMax[0] = pcVar13->m_quantizedAabbMax[0];
    pcVar11[(int)uVar10].m_quantizedAabbMax[1] = pcVar13->m_quantizedAabbMax[1];
    pcVar11[(int)uVar10].m_quantizedAabbMax[2] = pcVar13->m_quantizedAabbMax[2];
    pcVar11[(int)uVar10].m_rootNodeIndex = leftChildNodexIndex;
    pcVar11[(int)uVar10].m_subtreeSize = uVar3;
  }
  if ((int)uVar5 < 0x81) {
    uVar3 = (this->m_SubtreeHeaders).m_size;
    pcVar14 = pcVar14 + rightChildNodexIndex;
    uVar10 = uVar3;
    if (uVar3 == (this->m_SubtreeHeaders).m_capacity) {
      iVar15 = 1;
      if (uVar3 != 0) {
        iVar15 = uVar3 * 2;
      }
      if ((int)uVar3 < iVar15) {
        if (iVar15 == 0) {
          pcVar11 = (cbtBvhSubtreeInfo *)0x0;
        }
        else {
          pcVar11 = (cbtBvhSubtreeInfo *)cbtAlignedAllocInternal((long)iVar15 << 5,0x10);
          uVar10 = (this->m_SubtreeHeaders).m_size;
        }
        if (0 < (int)uVar10) {
          lVar12 = 0;
          do {
            puVar1 = (undefined8 *)
                     ((long)((this->m_SubtreeHeaders).m_data)->m_quantizedAabbMin + lVar12);
            uVar6 = puVar1[1];
            uVar7 = puVar1[2];
            uVar8 = puVar1[3];
            puVar2 = (undefined8 *)((long)pcVar11->m_quantizedAabbMin + lVar12);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            puVar2[2] = uVar7;
            puVar2[3] = uVar8;
            lVar12 = lVar12 + 0x20;
          } while ((ulong)uVar10 << 5 != lVar12);
        }
        pcVar4 = (this->m_SubtreeHeaders).m_data;
        if ((pcVar4 != (cbtBvhSubtreeInfo *)0x0) && ((this->m_SubtreeHeaders).m_ownsMemory == true))
        {
          cbtAlignedFreeInternal(pcVar4);
        }
        (this->m_SubtreeHeaders).m_ownsMemory = true;
        (this->m_SubtreeHeaders).m_data = pcVar11;
        (this->m_SubtreeHeaders).m_capacity = iVar15;
        uVar10 = (this->m_SubtreeHeaders).m_size;
      }
    }
    (this->m_SubtreeHeaders).m_size = uVar10 + 1;
    pcVar11 = (this->m_SubtreeHeaders).m_data;
    pcVar11[(int)uVar3].m_quantizedAabbMin[0] = pcVar14->m_quantizedAabbMin[0];
    pcVar11[(int)uVar3].m_quantizedAabbMin[1] = pcVar14->m_quantizedAabbMin[1];
    pcVar11[(int)uVar3].m_quantizedAabbMin[2] = pcVar14->m_quantizedAabbMin[2];
    pcVar11[(int)uVar3].m_quantizedAabbMax[0] = pcVar14->m_quantizedAabbMax[0];
    pcVar11[(int)uVar3].m_quantizedAabbMax[1] = pcVar14->m_quantizedAabbMax[1];
    pcVar11[(int)uVar3].m_quantizedAabbMax[2] = pcVar14->m_quantizedAabbMax[2];
    pcVar11[(int)uVar3].m_rootNodeIndex = rightChildNodexIndex;
    pcVar11[(int)uVar3].m_subtreeSize = uVar5;
  }
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  return;
}

Assistant:

void cbtQuantizedBvh::updateSubtreeHeaders(int leftChildNodexIndex, int rightChildNodexIndex)
{
	cbtAssert(m_useQuantization);

	cbtQuantizedBvhNode& leftChildNode = m_quantizedContiguousNodes[leftChildNodexIndex];
	int leftSubTreeSize = leftChildNode.isLeafNode() ? 1 : leftChildNode.getEscapeIndex();
	int leftSubTreeSizeInBytes = leftSubTreeSize * static_cast<int>(sizeof(cbtQuantizedBvhNode));

	cbtQuantizedBvhNode& rightChildNode = m_quantizedContiguousNodes[rightChildNodexIndex];
	int rightSubTreeSize = rightChildNode.isLeafNode() ? 1 : rightChildNode.getEscapeIndex();
	int rightSubTreeSizeInBytes = rightSubTreeSize * static_cast<int>(sizeof(cbtQuantizedBvhNode));

	if (leftSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		cbtBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(leftChildNode);
		subtree.m_rootNodeIndex = leftChildNodexIndex;
		subtree.m_subtreeSize = leftSubTreeSize;
	}

	if (rightSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		cbtBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(rightChildNode);
		subtree.m_rootNodeIndex = rightChildNodexIndex;
		subtree.m_subtreeSize = rightSubTreeSize;
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();
}